

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

string * __thiscall
testing::PrintToString<unique_ptr<Struct2>>
          (string *__return_storage_ptr__,testing *this,unique_ptr<Struct2> *value)

{
  long in_FS_OFFSET;
  stringstream ss;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::stringstream::stringstream(local_1a0);
  internal2::TypeWithoutFormatter<unique_ptr<Struct2>,_(testing::internal2::TypeKind)1>::PrintValue
            ((unique_ptr<Struct2> *)this,local_190);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

::std::string PrintToString(const T& value) {
  ::std::stringstream ss;
  internal::UniversalTersePrinter<T>::Print(value, &ss);
  return ss.str();
}